

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * adios2sys::SystemTools::CapitalizedWords(string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  string *n;
  undefined8 local_20;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  local_20 = 0;
  do {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= local_20) {
      return in_RDI;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    iVar1 = isalpha((int)*pcVar3);
    if (iVar1 != 0) {
      if (local_20 != 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        iVar1 = isspace((int)*pcVar3);
        if (iVar1 == 0) goto LAB_00f34eca;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      iVar1 = toupper((int)*pcVar3);
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar4 = (char)iVar1;
    }
LAB_00f34eca:
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::string SystemTools::CapitalizedWords(const std::string& s)
{
  std::string n(s);
  for (size_t i = 0; i < s.size(); i++) {
#if defined(_MSC_VER) && defined(_MT) && defined(_DEBUG)
    // MS has an assert that will fail if s[i] < 0; setting
    // LC_CTYPE using setlocale() does *not* help. Painful.
    if ((int)s[i] >= 0 && isalpha(s[i]) &&
        (i == 0 || ((int)s[i - 1] >= 0 && isspace(s[i - 1]))))
#else
    if (isalpha(s[i]) && (i == 0 || isspace(s[i - 1])))
#endif
    {
      n[i] = static_cast<std::string::value_type>(toupper(s[i]));
    }
  }
  return n;
}